

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor::ByteSizeLong(BayesianProbitRegressor *this)

{
  string *psVar1;
  int iVar2;
  uint uVar3;
  Type *value;
  size_t sVar4;
  uint i;
  uint index;
  ulong uVar5;
  
  uVar3 = (this->features_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar3;
  for (index = 0; uVar3 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
                      (&(this->features_).super_RepeatedPtrFieldBase,index);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                      (value);
    uVar5 = uVar5 + sVar4;
  }
  psVar1 = (this->regressioninputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 1;
  }
  psVar1 = (this->optimisminputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 1;
  }
  psVar1 = (this->samplingscaleinputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 1;
  }
  psVar1 = (this->samplingtruncationinputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 1;
  }
  psVar1 = (this->meanoutputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 2;
  }
  psVar1 = (this->varianceoutputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 2;
  }
  psVar1 = (this->pessimisticprobabilityoutputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 2;
  }
  psVar1 = (this->sampledprobabilityoutputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    uVar5 = uVar5 + sVar4 + 2;
  }
  if (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0 &&
      this != (BayesianProbitRegressor *)&_BayesianProbitRegressor_default_instance_) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                      (this->bias_);
    uVar5 = uVar5 + sVar4 + 1;
  }
  if (this->numberoffeatures_ != 0) {
    uVar3 = this->numberoffeatures_ | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar5 = uVar5 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)uVar5;
  return uVar5;
}

Assistant:

size_t BayesianProbitRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor)
  size_t total_size = 0;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  {
    unsigned int count = this->features_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->features(i));
    }
  }

  // string regressionInputFeatureName = 10;
  if (this->regressioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->regressioninputfeaturename());
  }

  // string optimismInputFeatureName = 11;
  if (this->optimisminputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->optimisminputfeaturename());
  }

  // string samplingScaleInputFeatureName = 12;
  if (this->samplingscaleinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->samplingscaleinputfeaturename());
  }

  // string samplingTruncationInputFeatureName = 13;
  if (this->samplingtruncationinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->samplingtruncationinputfeaturename());
  }

  // string meanOutputFeatureName = 20;
  if (this->meanoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->meanoutputfeaturename());
  }

  // string varianceOutputFeatureName = 21;
  if (this->varianceoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->varianceoutputfeaturename());
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (this->pessimisticprobabilityoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->pessimisticprobabilityoutputfeaturename());
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (this->sampledprobabilityoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->sampledprobabilityoutputfeaturename());
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->has_bias()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint32 numberOfFeatures = 1;
  if (this->numberoffeatures() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->numberoffeatures());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}